

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::StreamWideCharsToMessage(wchar_t *wstr,size_t length,Message *msg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char local_55 [13];
  string local_48;
  Message *local_28;
  size_t i;
  Message *msg_local;
  size_t length_local;
  wchar_t *wstr_local;
  
  local_28 = (Message *)0x0;
  i = (size_t)msg;
  msg_local = (Message *)length;
  length_local = (size_t)wstr;
  while (local_28 != msg_local) {
    if (*(int *)(length_local + (long)local_28 * 4) == 0) {
      local_55[0] = '\0';
      Message::operator<<((Message *)i,local_55);
      local_28 = (Message *)
                 ((long)&(local_28->ss_)._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl + 1);
    }
    else {
      WideStringToUtf8_abi_cxx11_
                (&local_48,(internal *)(length_local + (long)local_28 * 4),
                 (wchar_t *)(ulong)(uint)((int)msg_local - (int)local_28),(int)length_local);
      Message::operator<<((Message *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
      std::__cxx11::string::~string((string *)&local_48);
      while( true ) {
        bVar1 = false;
        if (local_28 != msg_local) {
          bVar1 = *(int *)(length_local + (long)local_28 * 4) != 0;
        }
        if (!bVar1) break;
        local_28 = (Message *)
                   ((long)&(local_28->ss_)._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 1);
      }
      in_stack_ffffffffffffff97 = 0;
    }
  }
  return;
}

Assistant:

static void StreamWideCharsToMessage(const wchar_t* wstr, size_t length,
                                     Message* msg) {
  for (size_t i = 0; i != length; ) {  // NOLINT
    if (wstr[i] != L'\0') {
      *msg << WideStringToUtf8(wstr + i, static_cast<int>(length - i));
      while (i != length && wstr[i] != L'\0')
        i++;
    } else {
      *msg << '\0';
      i++;
    }
  }
}